

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isadetection.c
# Opt level: O0

void cpuid(uint32_t *eax,uint32_t *ebx,uint32_t *ecx,uint32_t *edx)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t *edx_local;
  uint32_t *ecx_local;
  uint32_t *ebx_local;
  uint32_t *eax_local;
  
  uVar1 = *eax;
  if (uVar1 == 0) {
    puVar2 = (uint32_t *)cpuid_basic_info(0);
  }
  else if (uVar1 == 1) {
    puVar2 = (uint32_t *)cpuid_Version_info(1);
  }
  else if (uVar1 == 2) {
    puVar2 = (uint32_t *)cpuid_cache_tlb_info(2);
  }
  else if (uVar1 == 3) {
    puVar2 = (uint32_t *)cpuid_serial_info(3);
  }
  else if (uVar1 == 4) {
    puVar2 = (uint32_t *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (uVar1 == 5) {
    puVar2 = (uint32_t *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (uVar1 == 6) {
    puVar2 = (uint32_t *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (uVar1 == 7) {
    puVar2 = (uint32_t *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (uVar1 == 9) {
    puVar2 = (uint32_t *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (uVar1 == 10) {
    puVar2 = (uint32_t *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (uVar1 == 0xb) {
    puVar2 = (uint32_t *)cpuid_Extended_Topology_info(0xb);
  }
  else if (uVar1 == 0xd) {
    puVar2 = (uint32_t *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (uVar1 == 0xf) {
    puVar2 = (uint32_t *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (uVar1 == 0x80000002) {
    puVar2 = (uint32_t *)cpuid_brand_part1_info(0x80000002);
  }
  else if (uVar1 == 0x80000003) {
    puVar2 = (uint32_t *)cpuid_brand_part2_info(0x80000003);
  }
  else if (uVar1 == 0x80000004) {
    puVar2 = (uint32_t *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    puVar2 = (uint32_t *)cpuid(uVar1);
  }
  uVar1 = puVar2[1];
  uVar3 = puVar2[2];
  uVar4 = puVar2[3];
  *eax = *puVar2;
  *ebx = uVar1;
  *ecx = uVar4;
  *edx = uVar3;
  return;
}

Assistant:

static inline void cpuid(uint32_t *eax, uint32_t *ebx, uint32_t *ecx,
                         uint32_t *edx) {
#if CROARING_REGULAR_VISUAL_STUDIO
    int cpu_info[4];
    __cpuidex(cpu_info, *eax, *ecx);
    *eax = cpu_info[0];
    *ebx = cpu_info[1];
    *ecx = cpu_info[2];
    *edx = cpu_info[3];
#elif defined(HAVE_GCC_GET_CPUID) && defined(USE_GCC_GET_CPUID)
    uint32_t level = *eax;
    __get_cpuid(level, eax, ebx, ecx, edx);
#else
    uint32_t a = *eax, b, c = *ecx, d;
    __asm__("cpuid\n\t" : "+a"(a), "=b"(b), "+c"(c), "=d"(d));
    *eax = a;
    *ebx = b;
    *ecx = c;
    *edx = d;
#endif
}